

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttyio.c
# Opt level: O3

int ttwait(int msec)

{
  int iVar1;
  pollfd local_10;
  pollfd pfd [1];
  
  local_10.fd = 0;
  local_10.events = 1;
  iVar1 = poll(&local_10,1,msec);
  return (int)(iVar1 == 0);
}

Assistant:

int
ttwait(int msec)
{
	struct pollfd	pfd[1];

	pfd[0].fd = 0;
	pfd[0].events = POLLIN;

	if ((poll(pfd, 1, msec)) == 0)
		return (TRUE);
	return (FALSE);
}